

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O1

Var Js::JavascriptPromise::CreateThenPromise
              (JavascriptPromise *sourcePromise,RecyclableObject *fulfillmentHandler,
              RecyclableObject *rejectionHandler,ScriptContext *scriptContext)

{
  ImplicitCallFlags IVar1;
  RuntimeFunction *defaultConstructor;
  ThreadContext *this;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  Attributes attributes;
  RuntimeFunction *instanceObj;
  undefined4 *puVar5;
  JavascriptPromiseCapability *capability;
  
  defaultConstructor =
       (((scriptContext->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
       promiseConstructor.ptr;
  instanceObj = (RuntimeFunction *)
                JavascriptOperators::SpeciesConstructor
                          ((RecyclableObject *)sourcePromise,
                           &defaultConstructor->super_JavascriptFunction,scriptContext);
  bVar3 = JavascriptOperators::IsConstructor((RecyclableObject *)instanceObj);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x5a4,"(JavascriptOperators::IsConstructor(constructor))",
                                "JavascriptOperators::IsConstructor(constructor)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  this = scriptContext->threadContext;
  bVar3 = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  if (instanceObj == defaultConstructor) {
    capability = NewPromiseCapability(instanceObj,scriptContext);
    goto LAB_00cfea00;
  }
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)instanceObj);
  bVar4 = ThreadContext::HasNoSideEffect(this,(RecyclableObject *)instanceObj,attributes);
  if (bVar4) {
    capability = NewPromiseCapability(instanceObj,scriptContext);
    bVar4 = ThreadContext::IsOnStack(capability);
  }
  else {
    if ((this->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
      capability = (JavascriptPromiseCapability *)
                   (((((((((instanceObj->super_JavascriptFunction).super_DynamicObject.
                           super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                       super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
                    javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue.ptr;
      goto LAB_00cfea00;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this->implicitCallFlags;
      capability = NewPromiseCapability(instanceObj,scriptContext);
      this->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      goto LAB_00cfea00;
    }
    capability = NewPromiseCapability(instanceObj,scriptContext);
    bVar4 = ThreadContext::IsOnStack(capability);
  }
  if (bVar4 != false) {
    this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00cfea00:
  this->reentrancySafeOrHandled = bVar3;
  PerformPromiseThen(sourcePromise,capability,fulfillmentHandler,rejectionHandler,scriptContext);
  return (capability->promise).ptr;
}

Assistant:

Var JavascriptPromise::CreateThenPromise(JavascriptPromise* sourcePromise, RecyclableObject* fulfillmentHandler, RecyclableObject* rejectionHandler, ScriptContext* scriptContext)
    {
        JavascriptFunction* defaultConstructor = scriptContext->GetLibrary()->GetPromiseConstructor();
        RecyclableObject* constructor = JavascriptOperators::SpeciesConstructor(sourcePromise, defaultConstructor, scriptContext);
        AssertOrFailFast(JavascriptOperators::IsConstructor(constructor));

        bool isDefaultConstructor = constructor == defaultConstructor;
        JavascriptPromiseCapability* promiseCapability = (JavascriptPromiseCapability*)JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->JavascriptPromiseCapability*
        {
            return NewPromiseCapability(constructor, scriptContext);
        });

        PerformPromiseThen(sourcePromise, promiseCapability, fulfillmentHandler, rejectionHandler, scriptContext);

        return promiseCapability->GetPromise();
    }